

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O3

XMLCh * xercesc_4_0::XMLString::makeUName(XMLCh *pszURI,XMLCh *pszName)

{
  short *psVar1;
  void *__dest;
  XMLCh *pXVar2;
  long lVar3;
  long lVar4;
  short sVar5;
  XMLCh XVar6;
  XMLCh *pXVar7;
  long lVar8;
  ulong uVar9;
  size_t __n;
  short local_12;
  
  if (pszURI != (XMLCh *)0x0) {
    lVar4 = 0;
    do {
      psVar1 = (short *)((long)pszURI + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    if (lVar4 != 2) {
      lVar3 = 0;
      if (pszName != (XMLCh *)0x0) {
        do {
          psVar1 = (short *)((long)pszName + lVar3);
          lVar3 = lVar3 + 2;
        } while (*psVar1 != 0);
        lVar3 = (lVar3 >> 1) + -1;
      }
      uVar9 = 0xffffffffffffffff;
      if (-1 < (lVar4 >> 1) + lVar3 + 2) {
        uVar9 = ((lVar4 >> 1) + lVar3) * 2 + 4;
      }
      pXVar2 = (XMLCh *)operator_new__(uVar9);
      sVar5 = 0x7b;
      lVar4 = 0;
      do {
        *(short *)((long)pXVar2 + lVar4) = sVar5;
        sVar5 = *(short *)((long)&local_12 + lVar4);
        lVar4 = lVar4 + 2;
      } while (sVar5 != 0);
      *(undefined2 *)((long)pXVar2 + lVar4) = 0;
      lVar4 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
      XVar6 = *pszURI;
      if (XVar6 != L'\0') {
        pXVar7 = pszURI + 1;
        do {
          pXVar2[lVar4] = XVar6;
          lVar4 = lVar4 + 1;
          XVar6 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar6 != L'\0');
      }
      pXVar2[lVar4] = L'\0';
      lVar4 = 0;
      do {
        lVar3 = lVar4;
        lVar4 = lVar3 + 2;
      } while (*(short *)((long)pXVar2 + lVar3) != 0);
      sVar5 = 0x7d;
      lVar4 = 0;
      do {
        lVar8 = lVar4;
        *(short *)((long)pXVar2 + lVar8 + lVar3) = sVar5;
        sVar5 = *(short *)((long)&local_12 + lVar8);
        lVar4 = lVar8 + 2;
      } while (sVar5 != 0);
      *(undefined2 *)((long)pXVar2 + lVar8 + (lVar3 + 2 >> 1) * 2) = 0;
      lVar4 = 0;
      do {
        psVar1 = (short *)((long)pXVar2 + lVar4);
        lVar4 = lVar4 + 2;
      } while (*psVar1 != 0);
      lVar4 = (lVar4 >> 1) + -1;
      XVar6 = *pszName;
      if (XVar6 != L'\0') {
        pXVar7 = pszName + 1;
        do {
          pXVar2[lVar4] = XVar6;
          lVar4 = lVar4 + 1;
          XVar6 = *pXVar7;
          pXVar7 = pXVar7 + 1;
        } while (XVar6 != L'\0');
      }
      pXVar2[lVar4] = L'\0';
      return pXVar2;
    }
  }
  if (pszName == (XMLCh *)0x0) {
    return (XMLCh *)0x0;
  }
  __n = 0;
  do {
    psVar1 = (short *)((long)pszName + __n);
    __n = __n + 2;
  } while (*psVar1 != 0);
  __dest = (void *)(**(code **)(*XMLPlatformUtils::fgMemoryManager + 0x18))
                             (XMLPlatformUtils::fgMemoryManager,__n);
  pXVar2 = (XMLCh *)memcpy(__dest,pszName,__n);
  return pXVar2;
}

Assistant:

XMLCh*
XMLString::makeUName(const XMLCh* const pszURI, const XMLCh* const pszName)
{
    //
    //  If there is a URI, then format out the full name in the {uri}name
    //  form. Otherwise, just set it to the same thing as the base name.
    //
    XMLCh* pszRet = 0;
    const XMLSize_t uriLen = stringLen(pszURI);
    if (uriLen)
    {
        pszRet = new XMLCh[uriLen + stringLen(pszName) + 3];

        XMLCh szTmp[2];
        szTmp[1] = 0;

        szTmp[0] = chOpenCurly;
        copyString(pszRet, szTmp);
        catString(pszRet, pszURI);
        szTmp[0] = chCloseCurly;
        catString(pszRet, szTmp);
        catString(pszRet, pszName);
    }
     else
    {
        pszRet = replicate(pszName);
    }
    return pszRet;
}